

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O3

ssize_t __thiscall XmlRpc::XmlRpcValue::write(XmlRpcValue *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  tm *ptVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  uint *__n_00;
  int *__n_01;
  void *__buf_00;
  void *__buf_01;
  pointer pcVar5;
  long lVar6;
  undefined4 in_register_00000034;
  ostream *ostream_in;
  char *__s;
  uint uVar7;
  void *pvVar8;
  Encoder encoder;
  char buf [20];
  ios_base local_138 [264];
  
  ostream_in = (ostream *)CONCAT44(in_register_00000034,__fd);
  __n_00 = &switchD_0024fbfe::switchdataD_00264a2c;
  switch(this->_type) {
  case TypeBoolean:
    std::ostream::_M_insert<bool>(SUB41(__fd,0));
    break;
  case TypeInt:
    std::ostream::operator<<((ostream *)ostream_in,(this->_value).asInt);
    break;
  case TypeDouble:
    std::ostream::_M_insert<double>((this->_value).asDouble);
    break;
  case TypeString:
    __s = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
          super__Vector_impl_data._M_start;
    pcVar5 = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    goto LAB_0024fe34;
  case TypeDateTime:
    ptVar2 = (this->_value).asTime;
    __s = buf;
    snprintf(__s,0x13,"%4d%02d%02dT%02d:%02d:%02d",(ulong)(uint)ptVar2->tm_year,
             (ulong)(uint)ptVar2->tm_mon,(ulong)(uint)ptVar2->tm_mday,(ulong)(uint)ptVar2->tm_hour,
             (ulong)(uint)ptVar2->tm_min,(ulong)(uint)ptVar2->tm_sec);
    buf[0x13] = '\0';
    pcVar5 = (pointer)strlen(__s);
    goto LAB_0024fe34;
  case TypeBase64:
    std::__cxx11::stringstream::stringstream((stringstream *)buf);
    std::ostream::write(buf + 0x10,(long)(((this->_value).asString)->_M_dataplus)._M_p);
    base64::Encoder::Encoder(&encoder,0x200);
    base64::Encoder::encode(&encoder,(istream *)buf,ostream_in);
    std::__cxx11::stringstream::~stringstream((stringstream *)buf);
    std::ios_base::~ios_base(local_138);
    break;
  case TypeArray:
    pcVar5 = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1 = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    buf[0] = '{';
    std::__ostream_insert<char,std::char_traits<char>>(ostream_in,buf,1);
    uVar7 = (uint)((ulong)((long)pcVar5 - (long)pcVar1) >> 4);
    if (0 < (int)uVar7) {
      lVar6 = 0;
      pvVar8 = (void *)0x0;
      do {
        if (pvVar8 != (void *)0x0) {
          buf[0] = ',';
          std::__ostream_insert<char,std::char_traits<char>>(ostream_in,buf,1);
        }
        pcVar5 = (((this->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        __buf_01 = (void *)((long)(((this->_value).asBinary)->
                                  super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pcVar5 >> 4);
        if (__buf_01 <= pvVar8) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pvVar8);
        }
        write((XmlRpcValue *)(pcVar5 + lVar6),__fd,__buf_01,(size_t)__n_00);
        pvVar8 = (void *)((long)pvVar8 + 1);
        lVar6 = lVar6 + 0x10;
      } while ((void *)(ulong)(uVar7 & 0x7fffffff) != pvVar8);
    }
    buf[0] = '}';
    goto LAB_0024fe2c;
  case TypeStruct:
    buf[0] = '[';
    std::__ostream_insert<char,std::char_traits<char>>(ostream_in,buf,1);
    ptVar2 = (this->_value).asTime;
    p_Var4 = *(_Rb_tree_node_base **)&ptVar2->tm_wday;
    __n_01 = &ptVar2->tm_hour;
    if (p_Var4 != (_Rb_tree_node_base *)__n_01) {
      do {
        if (p_Var4 != *(_Rb_tree_node_base **)&ptVar2->tm_wday) {
          buf[0] = ',';
          std::__ostream_insert<char,std::char_traits<char>>(ostream_in,buf,1);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (ostream_in,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
        buf[0] = ':';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,buf,1);
        write((XmlRpcValue *)(p_Var4 + 2),__fd,__buf_00,(size_t)__n_01);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        ptVar2 = (this->_value).asTime;
        __n_01 = &ptVar2->tm_hour;
      } while (p_Var4 != (_Rb_tree_node_base *)__n_01);
    }
    buf[0] = ']';
LAB_0024fe2c:
    __s = buf;
    pcVar5 = (pointer)0x1;
LAB_0024fe34:
    std::__ostream_insert<char,std::char_traits<char>>(ostream_in,__s,(long)pcVar5);
  }
  return (ssize_t)ostream_in;
}

Assistant:

std::ostream& XmlRpcValue::write(std::ostream& os) const {
    switch (_type) {
      default:           break;
      case TypeBoolean:  os << _value.asBool; break;
      case TypeInt:      os << _value.asInt; break;
      case TypeDouble:   os << _value.asDouble; break;
      case TypeString:   os << *_value.asString; break;
      case TypeDateTime:
        {
          struct tm* t = _value.asTime;
          char buf[20];
          std::snprintf(buf, sizeof(buf)-1, "%4d%02d%02dT%02d:%02d:%02d", 
            t->tm_year,t->tm_mon,t->tm_mday,t->tm_hour,t->tm_min,t->tm_sec);
          buf[sizeof(buf)-1] = 0;
          os << buf;
          break;
        }
      case TypeBase64:
        {
          std::stringstream buffer;
          buffer.write(_value.asBinary->data(), _value.asBinary->size());
          base64::Encoder encoder;
          encoder.encode(buffer, os);
          break;
        }
      case TypeArray:
        {
          int s = int(_value.asArray->size());
          os << '{';
          for (int i=0; i<s; ++i)
          {
            if (i > 0) os << ',';
            _value.asArray->at(i).write(os);
          }
          os << '}';
          break;
        }
      case TypeStruct:
        {
          os << '[';
          ValueStruct::const_iterator it;
          for (it=_value.asStruct->begin(); it!=_value.asStruct->end(); ++it)
          {
            if (it!=_value.asStruct->begin()) os << ',';
            os << it->first << ':';
            it->second.write(os);
          }
          os << ']';
          break;
        }
    }
    
    return os;
  }